

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_shared_qualifier
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  undefined1 *puVar2;
  bool bVar3;
  ContextType ctxType;
  GLuint program;
  GLuint shader;
  char *__s;
  SsboArgs *pSVar4;
  SsboArgs *in_RCX;
  SsboArgs *args;
  long *plVar5;
  long lVar6;
  TestLog *in_R8;
  TestLog *log;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  GLint linkStatus;
  string shaderFragmentString;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  string message;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorVert;
  char *shaderFragmentCharPtr;
  string shaderVertexString;
  char *shaderVertexCharPtr;
  string versionString;
  SsboArgData argDataArrayFrag [3];
  SsboArgData argDataArrayVert [6];
  SsboArgs ssboArgs;
  undefined1 local_5c4 [12];
  string local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_598;
  string local_590;
  string local_570 [8];
  char *local_568;
  char local_560 [16];
  ArgMember local_550;
  ArgMember local_54c;
  ArgMember local_548 [2];
  string local_540;
  string local_520;
  GLchar *local_500;
  undefined8 local_4f8;
  GLchar local_4f0 [16];
  undefined1 local_4e0 [8];
  _Alloc_hider local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  SsboArgs *local_4b8;
  SsboArgs *local_4b0;
  GLchar *local_4a8;
  string local_4a0;
  long *local_480;
  long local_478;
  long local_470 [2];
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  local_460;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438 [6];
  ios_base local_3d0 [264];
  undefined1 local_2c8 [40];
  SsboArgData local_2a0;
  SsboArgData local_278;
  undefined1 local_250 [64];
  SsboArgData local_210;
  SsboArgData local_1e8;
  SsboArgData local_1c0;
  SsboArgData local_198;
  SsboArgData local_170;
  undefined1 local_148 [280];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_598 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ctx->super_CallLogWrapper).m_log;
  local_570 = (string  [8])local_560;
  local_568 = (char *)0x0;
  local_560[0] = '\0';
  __s = glu::getGLSLVersionDeclaration(bVar3 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,__s,(allocator<char> *)local_448);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,local_480,local_478 + (long)local_480);
  anon_unknown_0::args::SsboArgs::SsboArgs
            ((SsboArgs *)(local_148 + 8),&local_4a0,(TestLog *)&local_598->_M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  local_500 = local_4f0;
  local_4f8 = 0;
  local_4f0[0] = '\0';
  local_5c4._0_4_ = ARGMEMBER_FORMAT;
  local_448._0_8_ = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"shared","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            ((SsboArgData *)(local_250 + 0x18),(ArgMember *)local_5c4,(string *)local_448);
  local_5c4._8_4_ = 1;
  local_2c8._0_8_ = local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"0","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            (&local_210,(ArgMember *)(local_5c4 + 8),(string *)local_2c8);
  local_548[1] = 2;
  local_5b8._M_dataplus._M_p = local_5c4 + 0x1c;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_5c4 + 0xc),"column_major","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            (&local_1e8,local_548 + 1,(string *)(local_5c4 + 0xc));
  local_548[0] = ARGMEMBER_FIXED_ARRAY;
  puVar2 = local_5c4 + 0x44;
  local_590._M_dataplus._M_p = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_5c4 + 0x34),"10","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_1c0,local_548,(string *)(local_5c4 + 0x34));
  local_54c = ARGMEMBER_VARIABLE_ARRAY;
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"10","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_198,&local_54c,&local_540);
  local_550 = ARGMEMBER_REORDER;
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"false","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_170,&local_550,&local_520);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if (local_590._M_dataplus._M_p != puVar2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if (local_5b8._M_dataplus._M_p != local_5c4 + 0x1c) {
    operator_delete(local_5b8._M_dataplus._M_p,
                    CONCAT71(local_5b8.field_2._M_allocated_capacity._1_7_,
                             local_5b8.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != local_438) {
    operator_delete((void *)local_448._0_8_,local_438[0]._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&local_540,(SsboArgData *)(local_250 + 0x18),(SsboArgData *)local_148,
             (allocator_type *)in_RCX);
  local_520._M_dataplus._M_p._0_4_ = 2;
  local_448._0_8_ = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"row_major","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            ((SsboArgData *)local_2c8,(ArgMember *)&local_520,(string *)local_448);
  local_5c4._0_4_ = ARGMEMBER_VARIABLE_ARRAY;
  local_5b8._M_dataplus._M_p = local_5c4 + 0x1c;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_5c4 + 0xc),0x1aee929);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (&local_2a0,(ArgMember *)local_5c4,(string *)(local_5c4 + 0xc));
  local_5c4._8_4_ = 5;
  local_590._M_dataplus._M_p = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_5c4 + 0x34),"20","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            (&local_278,(ArgMember *)(local_5c4 + 8),(string *)(local_5c4 + 0x34));
  if (local_590._M_dataplus._M_p != puVar2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if (local_5b8._M_dataplus._M_p != local_5c4 + 0x1c) {
    operator_delete(local_5b8._M_dataplus._M_p,
                    CONCAT71(local_5b8.field_2._M_allocated_capacity._1_7_,
                             local_5b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != local_438) {
    operator_delete((void *)local_448._0_8_,local_438[0]._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)(local_5c4 + 0x34),(SsboArgData *)local_2c8,(SsboArgData *)local_250,
             (allocator_type *)in_RCX);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::vector(&local_460,
           (vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
            *)&local_540);
  bVar3 = anon_unknown_0::args::SsboArgs::setAllValues((SsboArgs *)(local_148 + 8),&local_460);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector(&local_460);
  if (bVar3) {
    NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
              ((string *)local_448,(_anonymous_namespace_ *)0x8b31,(int)local_148 + 8,in_RCX,in_R8);
    std::__cxx11::string::operator=((string *)&local_500,(string *)local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._0_8_ != local_438) {
      operator_delete((void *)local_448._0_8_,local_438[0]._M_allocated_capacity + 1);
    }
    local_4a8 = local_500;
    local_5c4._4_4_ = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
    std::__cxx11::string::_M_assign(local_570);
    poVar1 = (ostringstream *)(local_448 + 8);
    local_448._0_8_ = local_598;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_570,(long)local_568);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_3d0);
    log = (TestLog *)0x0;
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,local_5c4._4_4_,1,&local_4a8,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,local_5c4._4_4_);
    if (local_590._M_string_length - (long)local_590._M_dataplus._M_p != 0) {
      args = (SsboArgs *)
             (((long)(local_590._M_string_length - (long)local_590._M_dataplus._M_p) >> 3) *
             -0x3333333333333333);
      plVar5 = (long *)((long)local_590._M_dataplus._M_p + 0x10);
      pSVar4 = (SsboArgs *)0x0;
      local_4b8 = args;
      do {
        local_5c4._0_4_ = ~ARGMEMBER_FORMAT;
        local_5b8._M_dataplus._M_p = local_5c4 + 0x1c;
        local_5b8._M_string_length = 0;
        local_5b8.field_2._M_local_buf[0] = '\0';
        local_448._0_8_ = local_438;
        local_4b0 = pSVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
                   ,"");
        NegativeTestContext::beginSection(ctx,(string *)local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._0_8_ != local_438) {
          operator_delete((void *)local_448._0_8_,local_438[0]._M_allocated_capacity + 1);
        }
        program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
        std::
        vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
        ::vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                  *)local_250,
                 (vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                  *)&local_540);
        anon_unknown_0::args::SsboArgs::setAllValues
                  ((SsboArgs *)(local_148 + 8),
                   (vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                    *)local_250);
        std::
        vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
        ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                   *)local_250);
        local_4e0._0_4_ = *(undefined4 *)(plVar5 + -2);
        local_4d8._M_p = (pointer)&local_4c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4d8,plVar5[-1],*plVar5 + plVar5[-1]);
        anon_unknown_0::args::SsboArgs::setSingleValue
                  ((SsboArgs *)(local_148 + 8),(SsboArgData *)local_4e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_p != &local_4c8) {
          operator_delete(local_4d8._M_p,local_4c8._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
                  ((string *)local_448,(_anonymous_namespace_ *)0x8b30,(int)local_148 + 8,args,log);
        std::__cxx11::string::operator=((string *)(local_5c4 + 0xc),(string *)local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._0_8_ != local_438) {
          operator_delete((void *)local_448._0_8_,local_438[0]._M_allocated_capacity + 1);
        }
        local_520._M_dataplus._M_p = local_5b8._M_dataplus._M_p;
        shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
        std::__cxx11::string::_M_assign(local_570);
        local_448._0_8_ = local_598;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_448 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_448 + 8),(char *)local_570,(long)local_568);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_448 + 8));
        std::ios_base::~ios_base(local_3d0);
        log = (TestLog *)0x0;
        glu::CallLogWrapper::glShaderSource
                  (&ctx->super_CallLogWrapper,shader,1,(GLchar **)&local_520,(GLint *)0x0);
        glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader);
        glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,local_5c4._4_4_);
        glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader);
        glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program);
        args = (SsboArgs *)local_5c4;
        glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,program,0x8b82,(GLint *)args)
        ;
        logProgramInfo(ctx,program);
        if (local_5c4._0_4_ == ARGMEMBER_BINDING_POINT) {
          local_448._0_8_ = local_438;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_448,"Program should not have linked","");
          NegativeTestContext::fail(ctx,(string *)local_448);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._0_8_ != local_438) {
            operator_delete((void *)local_448._0_8_,local_438[0]._M_allocated_capacity + 1);
          }
        }
        glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
        glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
        NegativeTestContext::endSection(ctx);
        pSVar4 = local_4b0;
        if (local_5b8._M_dataplus._M_p != local_5c4 + 0x1c) {
          operator_delete(local_5b8._M_dataplus._M_p,
                          CONCAT71(local_5b8.field_2._M_allocated_capacity._1_7_,
                                   local_5b8.field_2._M_local_buf[0]) + 1);
        }
        pSVar4 = (SsboArgs *)((long)&(pSVar4->m_negativeContextVersion)._M_dataplus._M_p + 1);
        plVar5 = plVar5 + 5;
      } while (pSVar4 < local_4b8);
    }
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,local_5c4._4_4_);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)local_570,0,local_568,0x1c8a382);
    poVar1 = (ostringstream *)(local_448 + 8);
    local_448._0_8_ = local_598;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_570,(long)local_568);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_3d0);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)(local_5c4 + 0x34));
  lVar6 = -0x78;
  paVar7 = &local_278.data.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -5);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)&local_540);
  lVar6 = -0xf0;
  paVar7 = &local_170.data.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -5);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0);
  if (local_500 != local_4f0) {
    operator_delete(local_500,CONCAT71(local_4f0._1_7_,local_4f0[0]) + 1);
  }
  anon_unknown_0::args::SsboArgs::~SsboArgs((SsboArgs *)(local_148 + 8));
  if (local_480 != local_470) {
    operator_delete(local_480,local_470[0] + 1);
  }
  if (local_570 != (string  [8])local_560) {
    operator_delete((void *)local_570,CONCAT71(local_560._1_7_,local_560[0]) + 1);
  }
  return;
}

Assistant:

void ssbo_block_shared_qualifier(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	bool					result;
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// default args used in vertex shader ssbo
	const args::SsboArgData argDataArrayVert[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"shared"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"0"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"column_major"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"10"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"10"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"false") };
	std::vector<args::SsboArgData> argDataVectorVert(argDataArrayVert, argDataArrayVert + sizeof(argDataArrayVert) / sizeof(argDataArrayVert[0]));

	// args changed in fragment shader ssbo
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	""),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// set default vertex ssbo args
	result = ssboArgs.setAllValues(argDataVectorVert);

	if (result == false)
	{
		message = "Invalid use of args.setAllValues()";
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		return;
	}

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); idx++)
	{
		GLint		linkStatus				=	-1;
		GLint		program;
		GLint		shaderFragmentGL;
		std::string	shaderFragmentString;
		const char*	shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.setAllValues(argDataVectorVert);
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to the program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}